

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPf.c
# Opt level: O3

void Pf_StoCreateGateAdd(Pf_Man_t *pMan,word uTruth,int *pFans,int nFans,int CellId)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  Vec_Wec_t *p;
  uint Entry;
  Vec_Int_t *p_00;
  word uFunc;
  ulong local_38;
  ulong uVar7;
  
  Entry = (uint)uTruth & 1;
  uVar7 = (ulong)Entry;
  local_38 = -uVar7 ^ uTruth;
  uVar3 = Vec_MemHashInsert(pMan->vTtMem,&local_38);
  p = pMan->vTt2Match;
  if (uVar3 == p->nSize) {
    Vec_WecPushLevel(p);
    p = pMan->vTt2Match;
  }
  if (((int)uVar3 < 0) || (p->nSize <= (int)uVar3)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if (6 < nFans) {
    __assert_fail("nFans < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPf.c"
                  ,0x9e,"void Pf_StoCreateGateAdd(Pf_Man_t *, word, int *, int, int)");
  }
  p_00 = p->pArray + uVar3;
  if (0 < nFans) {
    bVar2 = 0;
    uVar6 = 0;
    do {
      uVar3 = pFans[uVar6];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10c,"int Abc_Lit2Var(int)");
      }
      Entry = (uint)uVar7 & 0xffffc0ff | ((uVar3 >> 1) << (bVar2 & 0x1f)) << 0xe |
              (((uVar3 & 1) << ((byte)uVar6 & 0x1f)) << 8 | (uint)uVar7) & 0x3f00;
      uVar7 = (ulong)Entry;
      uVar6 = uVar6 + 1;
      bVar2 = bVar2 + 3;
    } while ((uint)nFans != uVar6);
  }
  iVar1 = p_00->nSize;
  iVar4 = 0;
  if (1 < iVar1) {
    lVar5 = 1;
    do {
      if ((p_00->pArray[lVar5 + -1] == CellId) && (((p_00->pArray[lVar5] ^ Entry) & 0x3f00) == 0))
      break;
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < iVar1);
    iVar4 = (int)lVar5 + -1;
  }
  if (iVar4 == iVar1) {
    Vec_IntPush(p_00,CellId);
    Vec_IntPush(p_00,Entry);
    return;
  }
  return;
}

Assistant:

void Pf_StoCreateGateAdd( Pf_Man_t * pMan, word uTruth, int * pFans, int nFans, int CellId )
{
    Vec_Int_t * vArray;
    Pf_Mat_t Mat = Pf_Int2Mat(0);
    int i, GateId, Entry, fCompl = (int)(uTruth & 1);
    word uFunc = fCompl ? ~uTruth : uTruth;
    int iFunc = Vec_MemHashInsert( pMan->vTtMem, &uFunc );
    if ( iFunc == Vec_WecSize(pMan->vTt2Match) )
        Vec_WecPushLevel( pMan->vTt2Match );
    vArray = Vec_WecEntry( pMan->vTt2Match, iFunc );
    Mat.fCompl = fCompl;
    assert( nFans < 7 );
    for ( i = 0; i < nFans; i++ )
    {
        Mat.Perm  |= (unsigned)(Abc_Lit2Var(pFans[i]) << (3*i));
        Mat.Phase |= (unsigned)(Abc_LitIsCompl(pFans[i]) << i);
    }
    // check if the same one exists
    Vec_IntForEachEntryDouble( vArray, GateId, Entry, i )
        if ( GateId == CellId && Pf_Int2Mat(Entry).Phase == Mat.Phase )
            break;
    if ( i == Vec_IntSize(vArray) )
    {
        Vec_IntPush( vArray, CellId );
        Vec_IntPush( vArray, Pf_Mat2Int(Mat) );
    }
}